

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.cpp
# Opt level: O0

bool CompressScript(CScript *script,CompressedScript *out)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  uchar *puVar4;
  uchar *puVar5;
  byte *pbVar6;
  prevector<33U,_unsigned_char,_unsigned_int,_int> *in_RSI;
  CScript *in_RDI;
  long in_FS_OFFSET;
  CPubKey pubkey;
  CScriptID scriptID;
  CKeyID keyID;
  undefined5 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6d;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  uchar uVar7;
  undefined8 in_stack_ffffffffffffff70;
  size_type sVar8;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  undefined4 in_stack_ffffffffffffff90;
  size_type in_stack_ffffffffffffff94;
  prevector<33U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffff98;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined8 local_1c;
  undefined8 local_14;
  undefined4 local_c;
  
  sVar8 = (size_type)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CKeyID::CKeyID((CKeyID *)
                 CONCAT17(in_stack_ffffffffffffff6f,
                          CONCAT16(in_stack_ffffffffffffff6e,
                                   CONCAT15(in_stack_ffffffffffffff6d,in_stack_ffffffffffffff68))));
  bVar2 = IsToKeyID(in_RDI,(CKeyID *)in_RSI);
  if (bVar2) {
    prevector<33U,_unsigned_char,_unsigned_int,_int>::resize
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    puVar4 = prevector<33U,_unsigned_char,_unsigned_int,_int>::operator[](in_RSI,sVar8);
    *puVar4 = '\0';
    puVar4 = prevector<33U,_unsigned_char,_unsigned_int,_int>::operator[](in_RSI,sVar8);
    *(undefined8 *)puVar4 = local_1c;
    *(undefined8 *)(puVar4 + 8) = local_14;
    *(undefined4 *)(puVar4 + 0x10) = local_c;
    bVar2 = true;
  }
  else {
    CScriptID::CScriptID
              ((CScriptID *)
               CONCAT17(in_stack_ffffffffffffff6f,
                        CONCAT16(in_stack_ffffffffffffff6e,
                                 CONCAT15(in_stack_ffffffffffffff6d,in_stack_ffffffffffffff68))));
    bVar2 = IsToScriptID(in_RDI,(CScriptID *)in_RSI);
    if (bVar2) {
      prevector<33U,_unsigned_char,_unsigned_int,_int>::resize
                (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
      puVar4 = prevector<33U,_unsigned_char,_unsigned_int,_int>::operator[](in_RSI,sVar8);
      *puVar4 = '\x01';
      puVar4 = prevector<33U,_unsigned_char,_unsigned_int,_int>::operator[](in_RSI,sVar8);
      *(undefined8 *)puVar4 = local_30;
      *(undefined8 *)(puVar4 + 8) = local_28;
      *(undefined4 *)(puVar4 + 0x10) = local_20;
      bVar2 = true;
    }
    else {
      CPubKey::CPubKey((CPubKey *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  in_stack_ffffffffffffff68))));
      bVar2 = IsToPubKey((CScript *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (CPubKey *)
                         CONCAT17(in_stack_ffffffffffffff8f,
                                  CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
      if (bVar2) {
        prevector<33U,_unsigned_char,_unsigned_int,_int>::resize
                  (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
        puVar4 = prevector<33U,_unsigned_char,_unsigned_int,_int>::operator[](in_RSI,sVar8);
        puVar5 = CPubKey::operator[]((CPubKey *)in_RSI,(uint)((ulong)puVar4 >> 0x20));
        *(undefined8 *)puVar4 = *(undefined8 *)puVar5;
        *(undefined8 *)(puVar4 + 8) = *(undefined8 *)(puVar5 + 8);
        *(undefined8 *)(puVar4 + 0x10) = *(undefined8 *)(puVar5 + 0x10);
        *(undefined8 *)(puVar4 + 0x18) = *(undefined8 *)(puVar5 + 0x18);
        puVar5 = CPubKey::operator[]((CPubKey *)in_RSI,(uint)((ulong)puVar4 >> 0x20));
        sVar8 = (size_type)((ulong)puVar4 >> 0x20);
        if ((*puVar5 == '\x02') ||
           (puVar4 = CPubKey::operator[]((CPubKey *)in_RSI,sVar8), *puVar4 == '\x03')) {
          puVar4 = CPubKey::operator[]((CPubKey *)in_RSI,sVar8);
          uVar7 = *puVar4;
          puVar4 = prevector<33U,_unsigned_char,_unsigned_int,_int>::operator[](in_RSI,sVar8);
          *puVar4 = uVar7;
          bVar2 = true;
          goto LAB_01936fd7;
        }
        puVar4 = CPubKey::operator[]((CPubKey *)in_RSI,sVar8);
        if (*puVar4 == '\x04') {
          pbVar6 = CPubKey::operator[]((CPubKey *)in_RSI,sVar8);
          bVar3 = *pbVar6 & 1 | 4;
          pbVar6 = prevector<33U,_unsigned_char,_unsigned_int,_int>::operator[](in_RSI,sVar8);
          *pbVar6 = bVar3;
          bVar2 = true;
          goto LAB_01936fd7;
        }
      }
      bVar2 = false;
    }
  }
LAB_01936fd7:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool CompressScript(const CScript& script, CompressedScript& out)
{
    CKeyID keyID;
    if (IsToKeyID(script, keyID)) {
        out.resize(21);
        out[0] = 0x00;
        memcpy(&out[1], &keyID, 20);
        return true;
    }
    CScriptID scriptID;
    if (IsToScriptID(script, scriptID)) {
        out.resize(21);
        out[0] = 0x01;
        memcpy(&out[1], &scriptID, 20);
        return true;
    }
    CPubKey pubkey;
    if (IsToPubKey(script, pubkey)) {
        out.resize(33);
        memcpy(&out[1], &pubkey[1], 32);
        if (pubkey[0] == 0x02 || pubkey[0] == 0x03) {
            out[0] = pubkey[0];
            return true;
        } else if (pubkey[0] == 0x04) {
            out[0] = 0x04 | (pubkey[64] & 0x01);
            return true;
        }
    }
    return false;
}